

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O2

bool Imath_3_2::checkForZeroScaleInRow<float>(float *scl,Vec3<float> *row,bool exc)

{
  ulong uVar1;
  domain_error *this;
  float fVar2;
  float fVar3;
  
  fVar2 = *scl;
  if (fVar2 <= -fVar2) {
    fVar2 = -fVar2;
  }
  uVar1 = 0;
  do {
    if (uVar1 == 3) {
LAB_00124efa:
      return 2 < uVar1;
    }
    if (fVar2 < 1.0) {
      fVar3 = (&row->x)[uVar1];
      if (fVar3 <= -fVar3) {
        fVar3 = -fVar3;
      }
      if (fVar2 * 3.4028235e+38 <= fVar3) {
        if (exc) {
          this = (domain_error *)__cxa_allocate_exception(0x10);
          std::domain_error::domain_error(this,"Cannot remove zero scaling from matrix.");
          __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
        }
        goto LAB_00124efa;
      }
    }
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

bool
checkForZeroScaleInRow (const T& scl, const Vec3<T>& row, bool exc /* = true */)
{
    for (int i = 0; i < 3; i++)
    {
        if ((abs (scl) < 1 &&
             abs (row[i]) >= std::numeric_limits<T>::max () * abs (scl)))
        {
            if (exc)
                throw std::domain_error ("Cannot remove zero scaling "
                                         "from matrix.");
            else
                return false;
        }
    }

    return true;
}